

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_cgraph * ggml_new_graph_custom(ggml_context *ctx,size_t size,_Bool grads)

{
  ggml_hash_set *hash_set;
  size_t sVar1;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  ggml_bitset_t *hash_used;
  ggml_tensor **grad_accs_ptr;
  ggml_tensor **grads_ptr;
  ggml_tensor **hash_keys_ptr;
  ggml_tensor **leafs_ptr;
  ggml_tensor **nodes_ptr;
  void *p;
  size_t hash_size;
  ggml_cgraph *cgraph;
  ggml_object *obj;
  size_t obj_size;
  undefined8 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  size_t in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  ggml_object_type type;
  ggml_context *in_stack_ffffffffffffffa8;
  ggml_cgraph *local_40;
  size_t local_38;
  ggml_cgraph *local_30;
  ggml_object *local_28;
  size_t local_20;
  byte local_11;
  long local_10;
  long local_8;
  
  type = (ggml_object_type)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20 = ggml_graph_nbytes(CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                               SUB81((ulong)in_stack_ffffffffffffff38 >> 0x38,0));
  local_28 = ggml_new_object(in_stack_ffffffffffffffa8,type,in_stack_ffffffffffffff98);
  local_30 = (ggml_cgraph *)(*(long *)(local_8 + 8) + local_28->offs);
  local_38 = ggml_hash_size(local_10 << 1);
  local_40 = local_30 + 1;
  incr_ptr_aligned(&local_40,local_10 << 3,8);
  incr_ptr_aligned(&local_40,local_10 << 3,8);
  incr_ptr_aligned(&local_40,local_38 << 3,8);
  if ((local_11 & 1) != 0) {
    incr_ptr_aligned(&local_40,local_38 << 3,8);
  }
  if ((local_11 & 1) == 0) {
    hash_set = (ggml_hash_set *)0x0;
  }
  else {
    hash_set = (ggml_hash_set *)incr_ptr_aligned(&local_40,local_38 << 3,8);
  }
  sVar1 = ggml_bitset_size(local_38);
  incr_ptr_aligned(&local_40,sVar1 << 2,4);
  memcpy(local_30,&stack0xffffffffffffff40,0x50);
  ggml_hash_set_reset(hash_set);
  if ((local_11 & 1) != 0) {
    memset(local_30->grads,0,local_38 << 3);
    memset(local_30->grad_accs,0,local_38 << 3);
  }
  return local_30;
}

Assistant:

struct ggml_cgraph * ggml_new_graph_custom(struct ggml_context * ctx, size_t size, bool grads) {
    const size_t obj_size = ggml_graph_nbytes(size, grads);
    struct ggml_object * obj = ggml_new_object(ctx, GGML_OBJECT_TYPE_GRAPH, obj_size);
    struct ggml_cgraph * cgraph = (struct ggml_cgraph *) ((char *) ctx->mem_buffer + obj->offs);

    // the size of the hash table is doubled since it needs to hold both nodes and leafs
    size_t hash_size = ggml_hash_size(size * 2);

    void * p = cgraph + 1;

    struct ggml_tensor ** nodes_ptr     =         incr_ptr_aligned(&p, size      * sizeof(struct ggml_tensor *), sizeof(struct ggml_tensor *));
    struct ggml_tensor ** leafs_ptr     =         incr_ptr_aligned(&p, size      * sizeof(struct ggml_tensor *), sizeof(struct ggml_tensor *));
    struct ggml_tensor ** hash_keys_ptr =         incr_ptr_aligned(&p, hash_size * sizeof(struct ggml_tensor *), sizeof(struct ggml_tensor *));
    struct ggml_tensor ** grads_ptr     = grads ? incr_ptr_aligned(&p, hash_size * sizeof(struct ggml_tensor *), sizeof(struct ggml_tensor *)) : NULL;
    struct ggml_tensor ** grad_accs_ptr = grads ? incr_ptr_aligned(&p, hash_size * sizeof(struct ggml_tensor *), sizeof(struct ggml_tensor *)) : NULL;

    ggml_bitset_t * hash_used = incr_ptr_aligned(&p, ggml_bitset_size(hash_size) * sizeof(ggml_bitset_t), sizeof(ggml_bitset_t));

    // check that we allocated the correct amount of memory
    assert(obj_size == (size_t)((char *)p - (char *)cgraph));

    *cgraph = (struct ggml_cgraph) {
        /*.size         =*/ size,
        /*.n_nodes      =*/ 0,
        /*.n_leafs      =*/ 0,
        /*.nodes        =*/ nodes_ptr,
        /*.grads        =*/ grads_ptr,
        /*.grad_accs    =*/ grad_accs_ptr,
        /*.leafs        =*/ leafs_ptr,
        /*.hash_table   =*/ { hash_size, hash_used, hash_keys_ptr },
        /*.order        =*/ GGML_CGRAPH_EVAL_ORDER_LEFT_TO_RIGHT,
    };

    ggml_hash_set_reset(&cgraph->visited_hash_set);
    if (grads) {
        memset(cgraph->grads,     0, hash_size*sizeof(struct ggml_tensor *));
        memset(cgraph->grad_accs, 0, hash_size*sizeof(struct ggml_tensor *));
    }

    return cgraph;
}